

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_
          (OSTEI_VRR_Algorithm_Base *this,QAMList *order,QAM *am)

{
  QAM *pQVar1;
  bool bVar2;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> _Var3;
  size_type sVar4;
  undefined1 auVar5 [8];
  QAMList req;
  allocator local_f1;
  QAM *local_f0;
  char *local_e8;
  size_type local_e0;
  char local_d8 [8];
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  QAM *pQStack_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  char local_a8 [24];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<QAM*,std::vector<QAM,std::allocator<QAM>>>,__gnu_cxx::__ops::_Iter_equals_val<QAM_const>>
                    ((order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    sVar4 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::count(&this->allam_,am);
    if (sVar4 != 0) {
      local_f0 = am;
      std::__cxx11::string::string((string *)&local_e8,"",&local_f1);
      local_b8._M_p = local_a8;
      local_c8 = (undefined1  [8])0x0;
      pQStack_c0 = (QAM *)0x0;
      if (local_e8 == local_d8) {
        local_a8[8] = (undefined1)uStack_d0;
        local_a8[9] = uStack_d0._1_1_;
        local_a8[10] = uStack_d0._2_1_;
        local_a8[0xb] = uStack_d0._3_1_;
        local_a8[0xc] = uStack_d0._4_1_;
        local_a8[0xd] = uStack_d0._5_1_;
        local_a8[0xe] = uStack_d0._6_1_;
        local_a8[0xf] = uStack_d0._7_1_;
      }
      else {
        local_b8._M_p = local_e8;
      }
      local_b0 = local_e0;
      local_e0 = 0;
      local_d8[0] = '\0';
      local_e8 = local_d8;
      bVar2 = QAM::operator==(local_f0,(QAM *)local_c8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_e8);
      if (!bVar2) {
        QAM::QAM((QAM *)local_90,local_f0);
        GetAMReq((QAMList *)local_c8,this,(QAM *)local_90);
        std::__cxx11::string::~string((string *)(local_90 + 0x10));
        pQVar1 = pQStack_c0;
        for (auVar5 = local_c8; auVar5 != (undefined1  [8])pQVar1;
            auVar5 = (undefined1  [8])((long)auVar5 + 0x30)) {
          QAM::QAM((QAM *)local_60,(QAM *)auVar5);
          AMOrder_AddWithDependencies_(this,order,(QAM *)local_60);
          std::__cxx11::string::~string((string *)(local_60 + 0x10));
        }
        std::vector<QAM,_std::allocator<QAM>_>::push_back(order,local_f0);
        std::vector<QAM,_std::allocator<QAM>_>::~vector
                  ((vector<QAM,_std::allocator<QAM>_> *)local_c8);
      }
    }
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_(QAMList & order, QAM am) const
{
    // skip if it was already done somewhere
    if(std::find(order.begin(), order.end(), am) != order.end())
        return;

    // skip if it's not done by VRR
    if(allam_.count(am) == 0 || am == QAM{0,0,0,0})
        return;

    // get requirements
    auto req = GetAMReq(am);

    for(const auto & it : req)
        AMOrder_AddWithDependencies_(order, it);

    order.push_back(am);
}